

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mjs::hoisting_visitor::operator()(hoisting_visitor *this,switch_statement *s)

{
  pointer pcVar1;
  pointer puVar2;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *cs;
  pointer puVar3;
  case_clause *c;
  pointer pcVar4;
  
  pcVar1 = (s->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar4 = (s->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
    puVar2 = (pcVar4->sl_).
             super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (pcVar4->sl_).
                  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1)
    {
      accept<mjs::hoisting_visitor>
                ((puVar3->_M_t).
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
    }
  }
  return;
}

Assistant:

void operator()(const switch_statement& s) {
        for (const auto& c: s.cl()) {
            for (const auto& cs: c.sl()) {
                accept(*cs, *this);
            }
        }
    }